

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setPointSize(QFont *this,int pointSize)

{
  double dVar1;
  QFontPrivate *pQVar2;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (pointSize < 1) {
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_18 = "default";
    QMessageLogger::warning
              (local_30,"QFont::setPointSize: Point size <= 0 (%d), must be greater than 0");
  }
  else {
    if ((this->resolve_mask & 2) != 0) {
      dVar1 = (((this->d).d.ptr)->request).pointSize;
      if ((dVar1 == (double)pointSize) && (!NAN(dVar1) && !NAN((double)pointSize)))
      goto LAB_00481ca6;
    }
    detach(this);
    pQVar2 = (this->d).d.ptr;
    (pQVar2->request).pointSize = (double)pointSize;
    (pQVar2->request).pixelSize = -1.0;
    *(byte *)&this->resolve_mask = (byte)this->resolve_mask | 2;
  }
LAB_00481ca6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFont::setPointSize(int pointSize)
{
    if (pointSize <= 0) {
        qWarning("QFont::setPointSize: Point size <= 0 (%d), must be greater than 0", pointSize);
        return;
    }

    if ((resolve_mask & QFont::SizeResolved) && d->request.pointSize == qreal(pointSize))
        return;

    detach();

    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;

    resolve_mask |= QFont::SizeResolved;
}